

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_Proto3RequiredFields_Test::TestBody
          (ValidationErrorTest_Proto3RequiredFields_Test *this)

{
  string_view local_b0;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a0
  ;
  allocator<char> local_81;
  string local_80;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60
  ;
  allocator<char> local_31;
  string local_30;
  ValidationErrorTest_Proto3RequiredFields_Test *local_10;
  ValidationErrorTest_Proto3RequiredFields_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "name: \'foo.proto\' syntax: \'proto3\' message_type {   name: \'Foo\'   field { name:\'foo\' number:1 label:LABEL_REQUIRED type:TYPE_INT32 } }"
             ,&local_31);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_60,"foo.proto: Foo.foo: TYPE: Required fields are not allowed in proto3.\n");
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_30,&local_60);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_60);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "name: \'foo.proto\' syntax: \'proto3\' message_type {   name: \'Foo\'   nested_type {     name : \'Bar\'     field { name:\'bar\' number:1 label:LABEL_REQUIRED type:TYPE_INT32 }   } }"
             ,&local_81);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_a0,"foo.proto: Foo.Bar.bar: TYPE: Required fields are not allowed in proto3.\n");
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_80,&local_a0);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b0,
             "name: \'foo.proto\' syntax: \'proto3\' message_type {   name: \'Foo\'   field { name:\'foo\' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 }   field { name:\'bar\' number:2 label:LABEL_REPEATED type:TYPE_INT32 } }"
            );
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,local_b0);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, Proto3RequiredFields) {
  BuildFileWithErrors(
      "name: 'foo.proto' "
      "syntax: 'proto3' "
      "message_type { "
      "  name: 'Foo' "
      "  field { name:'foo' number:1 label:LABEL_REQUIRED type:TYPE_INT32 } "
      "}",
      "foo.proto: Foo.foo: TYPE: Required fields are not allowed in "
      "proto3.\n");

  // applied to nested types as well.
  BuildFileWithErrors(
      "name: 'foo.proto' "
      "syntax: 'proto3' "
      "message_type { "
      "  name: 'Foo' "
      "  nested_type { "
      "    name : 'Bar' "
      "    field { name:'bar' number:1 label:LABEL_REQUIRED type:TYPE_INT32 } "
      "  } "
      "}",
      "foo.proto: Foo.Bar.bar: TYPE: Required fields are not allowed in "
      "proto3.\n");

  // optional and repeated fields are OK.
  BuildFile(
      "name: 'foo.proto' "
      "syntax: 'proto3' "
      "message_type { "
      "  name: 'Foo' "
      "  field { name:'foo' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 } "
      "  field { name:'bar' number:2 label:LABEL_REPEATED type:TYPE_INT32 } "
      "}");
}